

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_gramma.hpp
# Opt level: O2

void __thiscall SwitchStatement::SwitchStatement(SwitchStatement *this)

{
  (this->super_AnalysisInterface)._vptr_AnalysisInterface = (_func_int **)&PTR_Parse_0016d778;
  (this->m_expression).super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_0016d1f8;
  (this->m_expression).m_term.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_0016d250;
  (this->m_switch_table).super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_0016d7d0;
  (this->m_switch_table).m_switch_child_statement.super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_0016d828;
  (this->m_default).super_AnalysisInterface._vptr_AnalysisInterface =
       (_func_int **)&PTR_Parse_0016d880;
  (this->m_bottom_label)._M_dataplus._M_p = (pointer)&(this->m_bottom_label).field_2;
  (this->m_bottom_label)._M_string_length = 0;
  (this->m_bottom_label).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

void LogOutput() {
        string str("This is a switch loop statement");
        g_log_tools->GrammaNormalLogs(str);
    }